

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface_ProblemToPolicyDiscretePure.h
# Opt level: O2

LIndex __thiscall
Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies
          (Interface_ProblemToPolicyDiscretePure *this,PolicyDomainCategory cat,size_t depth)

{
  ulong uVar1;
  LIndex LVar2;
  EOverflow *this_00;
  uint ag;
  ulong uVar3;
  bool bVar4;
  
  ag = 0;
  uVar3 = 1;
  do {
    uVar1 = (**(code **)(*(long *)this + 0x18))(this);
    if (uVar1 <= ag) {
      return uVar3;
    }
    LVar2 = GetNrPolicies(this,ag,cat,depth);
    ag = ag + 1;
    bVar4 = uVar3 <= LVar2 * uVar3;
    uVar3 = LVar2 * uVar3;
  } while (bVar4);
  this_00 = (EOverflow *)__cxa_allocate_exception(0x28);
  EOverflow::EOverflow
            (this_00,"Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies() overflow detected"
            );
  __cxa_throw(this_00,&EOverflow::typeinfo,E::~E);
}

Assistant:

LIndex GetNrJointPolicies(PolicyGlobals::PolicyDomainCategory cat, 
                                  size_t depth=MAXHORIZON) const
        {
            LIndex n=1;
            for(Index ag=0; ag < GetNrAgents(); ag++)
            {
                LIndex nOld=n;
                n *= GetNrPolicies(ag,cat,depth);
                if(n<nOld)
                    throw(EOverflow("Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies() overflow detected"));
            }

            return(n);
        }